

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.c
# Opt level: O0

apx_error_t apx_nodeData_create(apx_nodeData_t *self,apx_nodeDataBuffers_t *buffers)

{
  apx_nodeDataBuffers_t *buffers_local;
  apx_nodeData_t *self_local;
  
  if (self != (apx_nodeData_t *)0x0) {
    if (buffers == (apx_nodeDataBuffers_t *)0x0) {
      self->is_weak_ref = false;
      self->definition_data = (uint8_t *)0x0;
      self->require_port_data = (uint8_t *)0x0;
      self->provide_port_data = (uint8_t *)0x0;
      self->definition_data_size = 0;
      self->require_port_data_size = 0;
      self->provide_port_data_size = 0;
      self->require_port_connection_count = (apx_connectionCount_t *)0x0;
      self->provide_port_connection_count = (apx_connectionCount_t *)0x0;
      self->num_require_ports = 0;
      self->num_provide_ports = 0;
      self->checksum_type = '\0';
      memset(self->checksum_data,0,0x20);
    }
    else {
      self->is_weak_ref = true;
      self->definition_data = buffers->definition_data;
      self->require_port_data = buffers->require_port_data;
      self->provide_port_data = buffers->provide_port_data;
      self->definition_data_size = buffers->definition_data_size;
      self->require_port_data_size = buffers->require_port_data_size;
      self->provide_port_data_size = buffers->provide_port_data_size;
      self->require_port_connection_count = buffers->require_port_connection_count;
      self->provide_port_connection_count = buffers->provide_port_connection_count;
      self->num_require_ports = buffers->num_require_ports;
      self->num_provide_ports = buffers->num_provide_ports;
      apx_nodeData_set_checksum_data(self,buffers->checksum_type,buffers->checksum_data);
    }
    pthread_mutex_init((pthread_mutex_t *)&self->lock,(pthread_mutexattr_t *)0x0);
  }
  return 0;
}

Assistant:

apx_error_t apx_nodeData_create(apx_nodeData_t *self, apx_nodeDataBuffers_t *buffers)
{
   if (self != NULL)
   {
      if (buffers != NULL)
      {
         self->is_weak_ref = true;
         self->definition_data = buffers->definition_data;
         self->require_port_data = buffers->require_port_data;
         self->provide_port_data = buffers->provide_port_data;
         self->definition_data_size = buffers->definition_data_size;
         self->require_port_data_size = buffers->require_port_data_size;
         self->provide_port_data_size = buffers->provide_port_data_size;
         self->require_port_connection_count = buffers->require_port_connection_count;
         self->provide_port_connection_count = buffers->provide_port_connection_count;
         self->num_require_ports = buffers->num_require_ports;
         self->num_provide_ports = buffers->num_provide_ports;
         apx_nodeData_set_checksum_data(self, buffers->checksum_type, &buffers->checksum_data[0]);
      }
      else
      {
         self->is_weak_ref = false;
         self->definition_data = NULL;
         self->require_port_data = NULL;
         self->provide_port_data = NULL;
         self->definition_data_size = 0u;
         self->require_port_data_size = 0u;
         self->provide_port_data_size = 0u;
         self->require_port_connection_count = NULL;
         self->provide_port_connection_count = NULL;
         self->num_require_ports = 0u;
         self->num_provide_ports = 0u;
         self->checksum_type = RMF_DIGEST_TYPE_NONE;
         memset(&self->checksum_data[0], 0, sizeof(self->checksum_data));
      }
#ifndef APX_EMBEDDED
      MUTEX_INIT(self->lock);
#endif
   }
   return APX_NO_ERROR;
}